

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_GetLocaleData
              (RecyclableObject *function,CallInfo callInfo,...)

{
  size_t count;
  ScriptContext *scriptContext;
  JavascriptLibrary *this;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  uint32 length;
  HRESULT HVar4;
  undefined4 *puVar5;
  JavascriptString *pJVar6;
  LPCSTR pCVar7;
  JavascriptString *pJVar8;
  long lVar9;
  char *pcVar10;
  size_t sVar11;
  size_t sVar12;
  Recycler *pRVar13;
  char16_t *pcVar14;
  JavascriptString *pJVar15;
  JavascriptArray *pJVar16;
  int iVar17;
  Type *pTVar18;
  double dVar19;
  uint in_stack_00000010;
  Var in_stack_00000020;
  Var in_stack_00000028;
  char local_128 [8];
  char localeID [157];
  undefined1 local_80 [8];
  charcount_t unicodeCollation16Len;
  size_t local_70;
  char *local_68;
  DWORD local_60;
  undefined8 local_58;
  int collationLen;
  ScopedICUObject<UNumberingSystem_*,_&unumsys_close_70> local_48;
  ScopedUEnumeration collations;
  int local_34 [2];
  UErrorCode status;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  uVar3 = callInfo._0_4_;
  if (in_stack_00000010 != uVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,1099,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00a2f959;
    *puVar5 = 0;
  }
  if ((uVar3 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,1099,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) goto LAB_00a2f959;
    *puVar5 = 0;
  }
  _collationLen =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  if ((uVar3 & 0xffffff) == 3) {
    if ((((ulong)in_stack_00000020 >> 0x32 == 0) &&
        (bVar2 = TaggedInt::Is(in_stack_00000020), !bVar2)) ||
       (bVar2 = VarIs<Js::JavascriptString>(in_stack_00000028), !bVar2)) goto LAB_00a2eb23;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,1099,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar2) goto LAB_00a2f959;
      *puVar5 = 0;
    }
LAB_00a2eb23:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x450,
                                "((args.Info.Count == 3 && (JavascriptNumber::Is(args.Values[1]) || TaggedInt::Is(args.Values[1])) && VarIs<JavascriptString>(args.Values[2])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar2) goto LAB_00a2f959;
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(in_stack_00000020);
  if (bVar2) {
    uVar3 = TaggedInt::ToInt32(in_stack_00000020);
  }
  else {
    dVar19 = JavascriptNumber::GetValue(in_stack_00000020);
    uVar3 = (uint)dVar19;
  }
  local_34[0] = 0;
  memset((char (*) [157])local_128,0,0x9d);
  pJVar6 = UnsafeVarTo<Js::JavascriptString>(in_stack_00000028);
  LangtagToLocaleID<157ul>(pJVar6,(char (*) [157])local_128);
  if (5 < uVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x523,"(false)","GetLocaleData called with unknown kind parameter")
    ;
    if (bVar2) {
      *puVar5 = 0;
      return (UEnumeration *)0x0;
    }
    goto LAB_00a2f959;
  }
  this = (_collationLen->super_ScriptContextBase).javascriptLibrary;
  switch(uVar3) {
  case 1:
    local_80 = (undefined1  [8])ucol_open_70(local_128,local_34);
    iVar17 = ucol_getAttribute_70(local_80,2,local_34);
    if (local_34[0] == 7) {
      Throw::OutOfMemory();
    }
    if (0 < local_34[0] || local_34[0] == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      pCVar7 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x497,"(false)",pCVar7);
      if (!bVar2) goto LAB_00a2f959;
      *puVar5 = 0;
    }
    collations.object = (UEnumeration *)JavascriptLibrary::CreateArray(this,3);
    pTVar18 = &this->stringCache;
    pJVar6 = StringCache::GetFalseDisplay(pTVar18);
    pJVar15 = StringCache::GetIntlCaseFirstUpper(pTVar18);
    pJVar8 = StringCache::GetIntlCaseFirstLower(pTVar18);
    if (iVar17 == 0x19) {
      (**(code **)(*(long *)collations.object + 0x148))(collations.object,0,pJVar15,0);
LAB_00a2f910:
      (**(code **)(*(long *)collations.object + 0x148))(collations.object,1,pJVar8,0);
    }
    else {
      if (iVar17 == 0x18) {
        (**(code **)(*(long *)collations.object + 0x148))(collations.object,0,pJVar8,0);
        pJVar8 = pJVar15;
        goto LAB_00a2f910;
      }
      if (iVar17 != 0x10) goto LAB_00a2f93a;
      (**(code **)(*(long *)collations.object + 0x148))(collations.object,0,pJVar6,0);
      (**(code **)(*(long *)collations.object + 0x148))(collations.object,1,pJVar15,0);
      pJVar6 = pJVar8;
    }
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,2,pJVar6,0);
LAB_00a2f93a:
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UCollator_*,_&ucol_close_70>::~ScopedICUObject
              ((ScopedICUObject<UCollator_*,_&ucol_close_70> *)local_80);
    return collations.object;
  case 2:
    local_80 = (undefined1  [8])ucol_open_70(local_128,local_34);
    iVar17 = ucol_getAttribute_70(local_80,7,local_34);
    if (local_34[0] == 7) {
      Throw::OutOfMemory();
    }
    if (0 < local_34[0] || local_34[0] == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      pCVar7 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x4b5,"(false)",pCVar7);
      if (!bVar2) goto LAB_00a2f959;
      *puVar5 = 0;
    }
    collations.object = (UEnumeration *)JavascriptLibrary::CreateArray(this,2);
    pJVar6 = StringCache::GetFalseDisplay(&this->stringCache);
    pJVar8 = StringCache::GetTrueDisplay(&this->stringCache);
    if (iVar17 == 0x11) {
      (**(code **)(*(long *)collations.object + 0x148))(collations.object,0,pJVar8,0);
    }
    else {
      if (iVar17 != 0x10) goto LAB_00a2f93a;
      (**(code **)(*(long *)collations.object + 0x148))(collations.object,0,pJVar6,0);
      pJVar6 = pJVar8;
    }
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,1,pJVar6,0);
    goto LAB_00a2f93a;
  case 3:
    local_48.object =
         (UNumberingSystem *)ucal_getKeywordValuesForLocale_70("calendar",local_128,0,local_34);
    length = uenum_count_70(local_48.object,local_34);
    collations.object = (UEnumeration *)JavascriptLibrary::CreateArray(this,length);
    if (local_34[0] == 7) {
      Throw::OutOfMemory();
    }
    if (0 < local_34[0] || local_34[0] == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      pCVar7 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x4ca,"(false)",pCVar7);
      if (!bVar2) goto LAB_00a2f959;
      *puVar5 = 0;
    }
    local_58 = (char *)((ulong)local_58 & 0xffffffff00000000);
    lVar9 = uenum_next_70(local_48.object,&local_58,local_34);
    iVar17 = 0;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while (lVar9 != 0) {
      if (local_34[0] == 7) {
        Throw::OutOfMemory();
      }
      if (local_34[0] < 1 && local_34[0] != -0x7c) {
        if ((int)local_58 < 1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                      ,0x4d1,"(calendar != nullptr && calendarLen > 0)",
                                      "calendar != nullptr && calendarLen > 0");
          goto LAB_00a2f26a;
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        pCVar7 = (LPCSTR)u_errorName_70(local_34[0]);
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x4d1,"(false)",pCVar7);
LAB_00a2f26a:
        if (bVar2 == false) goto LAB_00a2f959;
        *puVar5 = 0;
      }
      pcVar10 = (char *)uloc_toUnicodeLocaleType_70("calendar",lVar9);
      ThrowOOMIfNull<char_const*>(pcVar10);
      sVar11 = strlen(pcVar10);
      pRVar13 = _collationLen->recycler;
      sVar12 = strlen(pcVar10);
      local_80 = (undefined1  [8])&char16_t::typeinfo;
      _unicodeCollation16Len = 0;
      local_70 = sVar12 + 1;
      local_68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
      ;
      local_60 = 0x4d8;
      pRVar13 = Memory::Recycler::TrackAllocInfo(pRVar13,(TrackAllocData *)local_80);
      sVar12 = strlen(pcVar10);
      pcVar14 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                          ((Memory *)pRVar13,(Recycler *)Memory::Recycler::AllocLeaf,0,sVar12 + 1);
      local_80 = (undefined1  [8])((ulong)local_80 & 0xffffffff00000000);
      HVar4 = utf8::NarrowStringToWideNoAlloc
                        (pcVar10,sVar11,pcVar14,sVar11 + 1,(charcount_t *)local_80);
      if (HVar4 == 0) {
        if ((0x7ffffffd < ((ulong)local_80 & 0xffffffff)) ||
           (sVar11 != ((ulong)local_80 & 0xffffffff))) goto LAB_00a2f329;
      }
      else {
LAB_00a2f329:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x4e4,
                                    "(hr == ((HRESULT)0x00000000L) && unicodeCalendar16Len == unicodeCalendarLen && unicodeCalendar16Len < MaxCharCount)"
                                    ,"Unicode calendar char16 conversion was unsuccessful");
        if (!bVar2) goto LAB_00a2f959;
        *puVar5 = 0;
      }
      pJVar6 = JavascriptString::NewWithBuffer(pcVar14,local_80._0_4_,_collationLen);
      (**(code **)(*(long *)collations.object + 0x148))(collations.object,iVar17,pJVar6,0);
      lVar9 = uenum_next_70(local_48.object,&local_58,local_34);
      iVar17 = iVar17 + 1;
    }
    goto LAB_00a2f8a7;
  case 4:
    local_48.object = (UNumberingSystem *)unumsys_open_70(local_128,local_34);
    if (local_34[0] == 7) {
      Throw::OutOfMemory();
    }
    if (0 < local_34[0] || local_34[0] == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      pCVar7 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x4f5,"(false)",pCVar7);
      if (!bVar2) goto LAB_00a2f959;
      *puVar5 = 0;
    }
    local_58 = (char *)unumsys_getName_70(local_48.object);
    utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
    NarrowWideConverter((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
                         *)local_80,(char **)&local_58,0xffffffffffffffff);
    collations.object = (UEnumeration *)JavascriptLibrary::CreateArray(this,0x16);
    pJVar6 = JavascriptString::NewCopySz((char16 *)local_80,_collationLen);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,0,pJVar6,0);
    pTVar18 = &this->stringCache;
    pJVar6 = StringCache::GetIntlNumsysArab(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,1,pJVar6,0);
    pJVar6 = StringCache::GetIntlNumsysArabext(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,2,pJVar6,0);
    pJVar6 = StringCache::GetIntlNumsysBali(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,3,pJVar6,0);
    pJVar6 = StringCache::GetIntlNumsysBeng(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,4,pJVar6,0);
    pJVar6 = StringCache::GetIntlNumsysDeva(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,5,pJVar6,0);
    pJVar6 = StringCache::GetIntlNumsysFullwide(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,6,pJVar6,0);
    pJVar6 = StringCache::GetIntlNumsysGujr(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,7,pJVar6,0);
    pJVar6 = StringCache::GetIntlNumsysGuru(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,8,pJVar6,0);
    pJVar6 = StringCache::GetIntlNumsysHanidec(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,9,pJVar6,0);
    pJVar6 = StringCache::GetIntlNumsysKhmr(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,10,pJVar6,0);
    pJVar6 = StringCache::GetIntlNumsysKnda(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,0xb,pJVar6,0);
    pJVar6 = StringCache::GetIntlNumsysLaoo(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,0xc,pJVar6,0);
    pJVar6 = StringCache::GetIntlNumsysLatn(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,0xd,pJVar6,0);
    pJVar6 = StringCache::GetIntlNumsysLimb(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,0xe,pJVar6,0);
    pJVar6 = StringCache::GetIntlNumsysMlym(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,0xf,pJVar6);
    pJVar6 = StringCache::GetIntlNumsysMong(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,0x10,pJVar6);
    pJVar6 = StringCache::GetIntlNumsysMymr(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,0x11,pJVar6);
    pJVar6 = StringCache::GetIntlNumsysOrya(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,0x12,pJVar6);
    pJVar6 = StringCache::GetIntlNumsysTamldec(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,0x13,pJVar6);
    pJVar6 = StringCache::GetIntlNumsysTelu(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,0x14,pJVar6);
    pJVar6 = StringCache::GetIntlNumsysThai(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,0x15,pJVar6);
    pJVar6 = StringCache::GetIntlNumsysTibt(pTVar18);
    (**(code **)(*(long *)collations.object + 0x148))(collations.object,0x16,pJVar6,0);
    utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
    ~NarrowWideConverter
              ((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
                *)local_80);
    PlatformAgnostic::ICUHelpers::ScopedICUObject<UNumberingSystem_*,_&unumsys_close_70>::
    ~ScopedICUObject(&local_48);
    return collations.object;
  case 5:
    pJVar16 = JavascriptLibrary::CreateArray(this,5);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,0,(this->super_JavascriptLibraryBase).nullValue.ptr,0);
    pTVar18 = &this->stringCache;
    pJVar6 = StringCache::GetIntlHourCycle11(pTVar18);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,1,pJVar6,0);
    pJVar6 = StringCache::GetIntlHourCycle12(pTVar18);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,2,pJVar6,0);
    pJVar6 = StringCache::GetIntlHourCycle23(pTVar18);
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,3,pJVar6,0);
    pJVar6 = StringCache::GetIntlHourCycle24(pTVar18);
    collations.object = (UEnumeration *)pJVar16;
    (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar16,4,pJVar6,0);
    return collations.object;
  }
  local_48.object =
       (UNumberingSystem *)ucol_getKeywordValuesForLocale_70("collation",local_128,0,local_34);
  iVar17 = uenum_count_70(local_48.object,local_34);
  if (local_34[0] == 7) {
    Throw::OutOfMemory();
  }
  if (local_34[0] < 1 && local_34[0] != -0x7c) {
    if (iVar17 < 3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x466,"(collationsCount > 2)","collationsCount > 2");
      goto LAB_00a2f633;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    pCVar7 = (LPCSTR)u_errorName_70(local_34[0]);
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x466,"(false)",pCVar7);
LAB_00a2f633:
    if (bVar2 == false) {
LAB_00a2f959:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pJVar16 = JavascriptLibrary::CreateArray(this,iVar17 - 1);
  (*(pJVar16->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
            (pJVar16,0,(this->super_JavascriptLibraryBase).nullValue.ptr,0);
  local_58 = (char *)((ulong)local_58._4_4_ << 0x20);
  collations.object = (UEnumeration *)pJVar16;
  pcVar10 = (char *)uenum_next_70(local_48.object,&local_58,local_34);
  stack0xffffffffffffff78 = 0;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while (pcVar10 != (char *)0x0) {
    if (local_34[0] == 7) {
      Throw::OutOfMemory();
    }
    if (local_34[0] < 1 && local_34[0] != -0x7c) {
      if ((int)local_58 < 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x471,"(collation != nullptr && collationLen > 0)",
                                    "collation != nullptr && collationLen > 0");
        goto LAB_00a2f733;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      pCVar7 = (LPCSTR)u_errorName_70(local_34[0]);
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x471,"(false)",pCVar7);
LAB_00a2f733:
      if (bVar2 == false) goto LAB_00a2f959;
      *puVar5 = 0;
    }
    iVar17 = strcmp(pcVar10,"standard");
    if ((iVar17 != 0) && (iVar17 = strcmp(pcVar10,"search"), iVar17 != 0)) {
      pcVar10 = (char *)uloc_toUnicodeLocaleType_70("collation",pcVar10);
      ThrowOOMIfNull<char_const*>(pcVar10);
      sVar11 = strlen(pcVar10);
      local_80 = (undefined1  [8])&char16_t::typeinfo;
      _unicodeCollation16Len = 0;
      count = sVar11 + 1;
      local_68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
      ;
      local_60 = 0x47d;
      local_70 = count;
      pRVar13 = Memory::Recycler::TrackAllocInfo(_collationLen->recycler,(TrackAllocData *)local_80)
      ;
      pcVar14 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                          ((Memory *)pRVar13,(Recycler *)Memory::Recycler::AllocLeaf,0,count);
      local_80 = (undefined1  [8])((ulong)local_80 & 0xffffffff00000000);
      HVar4 = utf8::NarrowStringToWideNoAlloc(pcVar10,sVar11,pcVar14,count,(charcount_t *)local_80);
      if (HVar4 == 0) {
        if ((0x7ffffffd < ((ulong)local_80 & 0xffffffff)) ||
           (sVar11 != ((ulong)local_80 & 0xffffffff))) goto LAB_00a2f808;
      }
      else {
LAB_00a2f808:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x489,
                                    "(hr == ((HRESULT)0x00000000L) && unicodeCollation16Len == unicodeCollationLen && unicodeCollation16Len < MaxCharCount)"
                                    ,"Unicode collation char16 conversion was unsuccessful");
        if (!bVar2) goto LAB_00a2f959;
        *puVar5 = 0;
      }
      pJVar6 = JavascriptString::NewWithBuffer(pcVar14,local_80._0_4_,_collationLen);
      register0x00000030 = (ulong)((int)stack0xffffffffffffff78 + 1);
      (**(code **)(*(long *)collations.object + 0x148))
                (collations.object,register0x00000030,pJVar6,0);
    }
    pcVar10 = (char *)uenum_next_70(local_48.object,&local_58,local_34);
  }
LAB_00a2f8a7:
  PlatformAgnostic::ICUHelpers::ScopedICUObject<UEnumeration_*,_&uenum_close_70>::~ScopedICUObject
            ((ScopedICUObject<UEnumeration_*,_&uenum_close_70> *)&local_48);
  return collations.object;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_GetLocaleData(RecyclableObject* function, CallInfo callInfo, ...)
    {
#ifdef INTL_ICU
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(
            args.Info.Count == 3 &&
            (JavascriptNumber::Is(args.Values[1]) || TaggedInt::Is(args.Values[1])) &&
            VarIs<JavascriptString>(args.Values[2])
        );

        LocaleDataKind kind = (LocaleDataKind) (TaggedInt::Is(args.Values[1])
            ? TaggedInt::ToInt32(args.Values[1])
            : (int) JavascriptNumber::GetValue(args.Values[1]));

        JavascriptArray *ret = nullptr;

        UErrorCode status = U_ZERO_ERROR;
        char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
        JavascriptString *langtag = UnsafeVarTo<JavascriptString>(args.Values[2]);
        LangtagToLocaleID(langtag, localeID);

        JavascriptLibrary *library = scriptContext->GetLibrary();
        PropertyOperationFlags flag = PropertyOperationFlags::PropertyOperation_None;

        if (kind == LocaleDataKind::Collation)
        {
            ScopedUEnumeration collations(ucol_getKeywordValuesForLocale("collation", localeID, false, &status));
            int collationsCount = uenum_count(collations, &status);

            // we expect collationsCount to have at least "standard" and "search" in it
            ICU_ASSERT(status, collationsCount > 2);

            // the return array can't include "standard" and "search", but must have its first element be null (count - 2 + 1) [#sec-intl-collator-internal-slots]
            ret = library->CreateArray(collationsCount - 1);
            ret->SetItem(0, library->GetNull(), flag);

            int collationLen = 0;
            const char *collation = nullptr;
            int i = 0;
            for (collation = uenum_next(collations, &collationLen, &status); collation != nullptr; collation = uenum_next(collations, &collationLen, &status))
            {
                ICU_ASSERT(status, collation != nullptr && collationLen > 0);
                if (strcmp(collation, "standard") == 0 || strcmp(collation, "search") == 0)
                {
                    // continue does not create holes in ret because i is set outside the loop
                    continue;
                }

                // OS#17172584: OOM during uloc_toUnicodeLocaleType can make this return nullptr even for known collations
                const char *unicodeCollation = ThrowOOMIfNull(uloc_toUnicodeLocaleType("collation", collation));
                const size_t unicodeCollationLen = strlen(unicodeCollation);

                // we only need strlen(unicodeCollation) + 1 char16s because unicodeCollation will always be ASCII (funnily enough)
                char16 *unicodeCollation16 = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, unicodeCollationLen + 1);
                charcount_t unicodeCollation16Len = 0;
                HRESULT hr = utf8::NarrowStringToWideNoAlloc(
                    unicodeCollation,
                    unicodeCollationLen,
                    unicodeCollation16,
                    unicodeCollationLen + 1,
                    &unicodeCollation16Len
                );
                AssertOrFailFastMsg(
                    hr == S_OK && unicodeCollation16Len == unicodeCollationLen && unicodeCollation16Len < MaxCharCount,
                    "Unicode collation char16 conversion was unsuccessful"
                );
                // i + 1 to not overwrite leading null element
                ret->SetItem(i + 1, JavascriptString::NewWithBuffer(
                    unicodeCollation16,
                    unicodeCollation16Len,
                    scriptContext
                ), PropertyOperationFlags::PropertyOperation_None);
                i++;
            }
        }
        else if (kind == LocaleDataKind::CaseFirst)
        {
            ScopedUCollator collator(ucol_open(localeID, &status));
            UColAttributeValue kf = ucol_getAttribute(collator, UCOL_CASE_FIRST, &status);
            ICU_ASSERT(status, true);
            ret = library->CreateArray(3);

            JavascriptString *falseStr = library->GetFalseDisplayString();
            JavascriptString *upperStr = library->GetIntlCaseFirstUpperString();
            JavascriptString *lowerStr = library->GetIntlCaseFirstLowerString();

            if (kf == UCOL_OFF)
            {
                ret->SetItem(0, falseStr, flag);
                ret->SetItem(1, upperStr, flag);
                ret->SetItem(2, lowerStr, flag);
            }
            else if (kf == UCOL_UPPER_FIRST)
            {
                ret->SetItem(0, upperStr, flag);
                ret->SetItem(1, lowerStr, flag);
                ret->SetItem(2, falseStr, flag);
            }
            else if (kf == UCOL_LOWER_FIRST)
            {
                ret->SetItem(0, lowerStr, flag);
                ret->SetItem(1, upperStr, flag);
                ret->SetItem(2, falseStr, flag);
            }
        }
        else if (kind == LocaleDataKind::Numeric)
        {
            ScopedUCollator collator(ucol_open(localeID, &status));
            UColAttributeValue kn = ucol_getAttribute(collator, UCOL_NUMERIC_COLLATION, &status);
            ICU_ASSERT(status, true);
            ret = library->CreateArray(2);

            JavascriptString *falseStr = library->GetFalseDisplayString();
            JavascriptString *trueStr = library->GetTrueDisplayString();

            if (kn == UCOL_OFF)
            {
                ret->SetItem(0, falseStr, flag);
                ret->SetItem(1, trueStr, flag);
            }
            else if (kn == UCOL_ON)
            {
                ret->SetItem(0, trueStr, flag);
                ret->SetItem(1, falseStr, flag);
            }
        }
        else if (kind == LocaleDataKind::Calendar)
        {
            ScopedUEnumeration calendars(ucal_getKeywordValuesForLocale("calendar", localeID, false, &status));
            ret = library->CreateArray(uenum_count(calendars, &status));
            ICU_ASSERT(status, true);

            int calendarLen = 0;
            const char *calendar = nullptr;
            int i = 0;
            for (calendar = uenum_next(calendars, &calendarLen, &status); calendar != nullptr; calendar = uenum_next(calendars, &calendarLen, &status))
            {
                ICU_ASSERT(status, calendar != nullptr && calendarLen > 0);

                // OS#17172584: OOM during uloc_toUnicodeLocaleType can make this return nullptr even for known calendars
                const char *unicodeCalendar = ThrowOOMIfNull(uloc_toUnicodeLocaleType("calendar", calendar));
                const size_t unicodeCalendarLen = strlen(unicodeCalendar);

                // we only need strlen(unicodeCalendar) + 1 char16s because unicodeCalendar will always be ASCII (funnily enough)
                char16 *unicodeCalendar16 = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, strlen(unicodeCalendar) + 1);
                charcount_t unicodeCalendar16Len = 0;
                HRESULT hr = utf8::NarrowStringToWideNoAlloc(
                    unicodeCalendar,
                    unicodeCalendarLen,
                    unicodeCalendar16,
                    unicodeCalendarLen + 1,
                    &unicodeCalendar16Len
                );
                AssertOrFailFastMsg(
                    hr == S_OK && unicodeCalendar16Len == unicodeCalendarLen && unicodeCalendar16Len < MaxCharCount,
                    "Unicode calendar char16 conversion was unsuccessful"
                );
                ret->SetItem(i, JavascriptString::NewWithBuffer(
                    unicodeCalendar16,
                    static_cast<charcount_t>(unicodeCalendar16Len),
                    scriptContext
                ), flag);
                i++;
            }
        }
        else if (kind == LocaleDataKind::NumberingSystem)
        {
            // unumsys_openAvailableNames has multiple bugs (http://bugs.icu-project.org/trac/ticket/11908) and also
            // does not provide a locale-specific set of numbering systems
            // the Intl spec provides a list of required numbering systems to support in #table-numbering-system-digits
            // For now, assume that all of those numbering systems are supported, and just get the default using unumsys_open
            // unumsys_open will also ensure that "native", "traditio", and "finance" are not returned, as per #sec-intl.datetimeformat-internal-slots
            ScopedUNumberingSystem numsys(unumsys_open(localeID, &status));
            ICU_ASSERT(status, true);
            utf8::NarrowToWide numsysName(unumsys_getName(numsys));

            // NOTE: update the initial array length if the list of available numbering systems changes in the future!
            ret = library->CreateArray(22);
            int i = 0;
            ret->SetItem(i++, JavascriptString::NewCopySz(numsysName, scriptContext), flag);

            // It doesn't matter that item 0 will be in the array twice (aside for size), because item 0 is the
            // preferred numbering system for the given locale, so it has precedence over everything else
            ret->SetItem(i++, library->GetIntlNumsysArabString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysArabextString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysBaliString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysBengString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysDevaString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysFullwideString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysGujrString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysGuruString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysHanidecString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysKhmrString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysKndaString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysLaooString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysLatnString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysLimbString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysMlymString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysMongString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysMymrString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysOryaString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysTamldecString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysTeluString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysThaiString(), flag);
            ret->SetItem(i++, library->GetIntlNumsysTibtString(), flag);
        }
        else if (kind == LocaleDataKind::HourCycle)
        {
            // #sec-intl.datetimeformat-internal-slots: "[[LocaleData]][locale].hc must be < null, h11, h12, h23, h24 > for all locale values"
            ret = library->CreateArray(5);
            int i = 0;
            ret->SetItem(i++, library->GetNull(), flag);
            ret->SetItem(i++, library->GetIntlHourCycle11String(), flag);
            ret->SetItem(i++, library->GetIntlHourCycle12String(), flag);
            ret->SetItem(i++, library->GetIntlHourCycle23String(), flag);
            ret->SetItem(i++, library->GetIntlHourCycle24String(), flag);
        }
        else
        {
            AssertOrFailFastMsg(false, "GetLocaleData called with unknown kind parameter");
        }

        return ret;
#else
        AssertOrFailFastMsg(false, "Intl with Windows Globalization should never call GetLocaleData");
        return nullptr;
#endif
    }